

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariantanimation.cpp
# Opt level: O3

QVariant * __thiscall
QVariantAnimationPrivate::valueAt
          (QVariant *__return_storage_ptr__,QVariantAnimationPrivate *this,qreal step)

{
  pair<double,_QVariant> *ppVar1;
  ulong uVar2;
  difference_type __d;
  ulong uVar3;
  pair<double,_QVariant> *ppVar4;
  long in_FS_OFFSET;
  anon_union_24_3_e3d07ef4_for_data local_68;
  undefined8 local_50;
  qreal local_40;
  anon_union_24_3_e3d07ef4_for_data local_38;
  undefined8 local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.shared = (PrivateShared *)0x0;
  local_68._8_8_ = 0;
  local_68._16_8_ = 0;
  local_38.shared = (PrivateShared *)0x0;
  local_38._8_8_ = 0;
  local_38._16_8_ = 0;
  local_20 = 2;
  local_50 = 2;
  local_40 = step;
  ::QVariant::~QVariant((QVariant *)&local_68);
  ppVar4 = (this->keyValues).d.ptr;
  uVar3 = (this->keyValues).d.size;
  ppVar1 = ppVar4 + uVar3;
  while (uVar2 = uVar3, 0 < (long)uVar2) {
    uVar3 = uVar2 >> 1;
    if (ppVar4[uVar3].first <= step && step != ppVar4[uVar3].first) {
      ppVar4 = ppVar4 + uVar3 + 1;
      uVar3 = ~uVar3 + uVar2;
    }
  }
  if ((ppVar4 == ppVar1) || (step < ppVar4->first)) {
    (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
    *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
  }
  else {
    ::QVariant::QVariant(__return_storage_ptr__,&ppVar4->second);
  }
  ::QVariant::~QVariant((QVariant *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QVariant QVariantAnimationPrivate::valueAt(qreal step) const
{
    const auto sought = std::pair{step, QVariant()};
    const auto result = std::lower_bound(keyValues.cbegin(), keyValues.cend(), sought,
                                         animationValueLessThan);
    if (result != keyValues.cend() && !animationValueLessThan(sought, *result))
        return result->second;

    return QVariant();
}